

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes31Context.cpp
# Opt level: O2

void __thiscall deqp::gles31::Context::destroyRenderContext(Context *this)

{
  if (this->m_contextInfo != (ContextInfo *)0x0) {
    (*this->m_contextInfo->_vptr_ContextInfo[1])();
  }
  if (this->m_renderCtx != (RenderContext *)0x0) {
    (*this->m_renderCtx->_vptr_RenderContext[1])();
  }
  this->m_renderCtx = (RenderContext *)0x0;
  this->m_contextInfo = (ContextInfo *)0x0;
  return;
}

Assistant:

void Context::destroyRenderContext (void)
{
	delete m_contextInfo;
	delete m_renderCtx;

	m_contextInfo	= DE_NULL;
	m_renderCtx		= DE_NULL;
}